

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_strategy ZVar6;
  ZSTD_compressionParameters cPar;
  uint uVar7;
  ZSTD_compressionParameters local_44;
  
  if (srcSizeHint == 0xffffffffffffffff) {
    srcSizeHint = 0xffffffffffffffff;
    if (0 < (long)CCtxParams->srcSizeHint) {
      srcSizeHint = (long)CCtxParams->srcSizeHint;
    }
  }
  ZSTD_getCParams_internal(&local_44,CCtxParams->compressionLevel,srcSizeHint,dictSize);
  uVar7 = 0x1b;
  if ((CCtxParams->ldmParams).enableLdm == 0) {
    uVar7 = local_44.windowLog;
  }
  uVar1 = (CCtxParams->cParams).windowLog;
  uVar2 = (CCtxParams->cParams).chainLog;
  if (uVar1 != 0) {
    uVar7 = uVar1;
  }
  uVar1 = (CCtxParams->cParams).hashLog;
  if (uVar1 == 0) {
    uVar1 = local_44.hashLog;
  }
  if (uVar2 == 0) {
    uVar2 = local_44.chainLog;
  }
  uVar3 = (CCtxParams->cParams).searchLog;
  if (uVar3 == 0) {
    uVar3 = local_44.searchLog;
  }
  uVar4 = (CCtxParams->cParams).minMatch;
  if (uVar4 == 0) {
    uVar4 = local_44.minMatch;
  }
  uVar5 = (CCtxParams->cParams).targetLength;
  if (uVar5 == 0) {
    uVar5 = local_44.targetLength;
  }
  ZVar6 = (CCtxParams->cParams).strategy;
  if (ZVar6 == 0) {
    ZVar6 = local_44.strategy;
  }
  if ((((0xffffffe9 < uVar7 - 0x20) && (0xffffffe6 < uVar2 - 0x1f)) && (0xffffffe6 < uVar1 - 0x1f))
     && (((0xffffffe1 < uVar3 - 0x1f && (uVar4 - 3 < 5)) &&
         ((uVar5 < 0x20001 && (ZVar6 - ZSTD_fast < 9)))))) {
    cPar.chainLog = uVar2;
    cPar.windowLog = uVar7;
    cPar.strategy = ZVar6;
    cPar.targetLength = uVar5;
    cPar.hashLog = uVar1;
    cPar.searchLog = uVar3;
    cPar.minMatch = uVar4;
    ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
    return __return_storage_ptr__;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2e86,
                "ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(const ZSTD_CCtx_params *, U64, size_t)"
               );
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    if (CCtxParams->cParams.windowLog) cParams.windowLog = CCtxParams->cParams.windowLog;
    if (CCtxParams->cParams.hashLog) cParams.hashLog = CCtxParams->cParams.hashLog;
    if (CCtxParams->cParams.chainLog) cParams.chainLog = CCtxParams->cParams.chainLog;
    if (CCtxParams->cParams.searchLog) cParams.searchLog = CCtxParams->cParams.searchLog;
    if (CCtxParams->cParams.minMatch) cParams.minMatch = CCtxParams->cParams.minMatch;
    if (CCtxParams->cParams.targetLength) cParams.targetLength = CCtxParams->cParams.targetLength;
    if (CCtxParams->cParams.strategy) cParams.strategy = CCtxParams->cParams.strategy;
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize);
}